

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t * roaring_bitmap_and(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  uint32_t uVar1;
  uint16_t *puVar2;
  uint16_t *puVar3;
  int iVar4;
  byte bVar5;
  int *c;
  int *piVar6;
  int iVar7;
  long lVar8;
  uint8_t uVar9;
  uint32_t cap;
  uint uVar10;
  ushort uVar11;
  uint uVar12;
  ushort uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uint8_t result_type;
  uint8_t local_3d;
  uint32_t local_3c;
  roaring_array_t *local_38;
  
  local_3d = '\0';
  uVar1 = (x1->high_low_container).size;
  local_3c = (x2->high_low_container).size;
  cap = local_3c;
  if ((int)uVar1 < (int)local_3c) {
    cap = uVar1;
  }
  local_38 = &roaring_bitmap_create_with_capacity(cap)->high_low_container;
  bVar5 = 1;
  if (((x1->high_low_container).flags & 1) == 0) {
    bVar5 = (x2->high_low_container).flags & 1;
  }
  local_38->flags = local_38->flags & 0xfe | bVar5;
  if (0 < (int)local_3c && 0 < (int)uVar1) {
    uVar17 = 0;
    uVar15 = 0;
    do {
      puVar2 = (x1->high_low_container).keys;
      uVar16 = (uint)uVar17;
      uVar10 = uVar16 & 0xffff;
      uVar13 = puVar2[uVar10];
      puVar3 = (x2->high_low_container).keys;
      uVar14 = (uint)uVar15;
      uVar12 = uVar14 & 0xffff;
      uVar11 = puVar3[uVar12];
      if (uVar13 == uVar11) {
        c = (int *)container_and((x1->high_low_container).containers[uVar10],
                                 (x1->high_low_container).typecodes[uVar10],
                                 (x2->high_low_container).containers[uVar12],
                                 (x2->high_low_container).typecodes[uVar12],&local_3d);
        piVar6 = c;
        uVar9 = local_3d;
        if (local_3d == '\x04') {
          uVar9 = (uint8_t)c[2];
          piVar6 = *(int **)c;
        }
        iVar7 = *piVar6;
        if ((uVar9 == '\x03') || (uVar9 == '\x02')) {
          if (iVar7 < 1) goto LAB_0010441b;
LAB_00104428:
          ra_append(local_38,uVar13,c,local_3d);
        }
        else {
          if (iVar7 != 0) {
            if (iVar7 != -1) goto LAB_00104428;
            lVar8 = 0;
            do {
              if (*(long *)(*(long *)(piVar6 + 2) + lVar8 * 8) != 0) goto LAB_00104428;
              lVar8 = lVar8 + 1;
            } while (lVar8 != 0x400);
          }
LAB_0010441b:
          container_free(c,local_3d);
        }
        uVar17 = (ulong)(uVar16 + 1);
        uVar15 = (ulong)(uVar14 + 1);
      }
      else if (uVar13 < uVar11) {
        uVar14 = (x1->high_low_container).size;
        uVar10 = uVar16 + 1;
        if (((int)uVar10 < (int)uVar14) && (puVar2[(int)uVar10] < uVar11)) {
          uVar16 = uVar16 + 2;
          iVar7 = 1;
          if ((int)uVar16 < (int)uVar14) {
            iVar7 = 1;
            do {
              uVar17 = (ulong)uVar16;
              uVar13 = puVar2[(int)uVar16];
              if (uVar11 <= uVar13) goto LAB_00104373;
              iVar4 = iVar7 * 2;
              uVar16 = uVar10 + iVar7 * 2;
              iVar7 = iVar4;
            } while ((int)uVar16 < (int)uVar14);
          }
          uVar13 = puVar2[(long)(int)uVar14 + -1];
          uVar17 = (long)(int)uVar14 - 1;
LAB_00104373:
          if (uVar13 != uVar11) {
            if (uVar13 < uVar11) {
              uVar17 = (ulong)uVar14;
            }
            else if ((iVar7 >> 1) + uVar10 + 1 != (int)uVar17) {
              uVar10 = (iVar7 >> 1) + uVar10;
              do {
                uVar16 = (int)(uVar10 + (int)uVar17) >> 1;
                if (puVar2[(int)uVar16] == uVar11) {
                  uVar17 = (ulong)uVar16;
                  break;
                }
                if (uVar11 <= puVar2[(int)uVar16]) {
                  uVar17 = (ulong)uVar16;
                  uVar16 = uVar10;
                }
                uVar10 = uVar16;
              } while (uVar10 + 1 != (int)uVar17);
            }
          }
        }
        else {
          uVar17 = (ulong)uVar10;
        }
      }
      else {
        uVar16 = (x2->high_low_container).size;
        uVar10 = uVar14 + 1;
        if (((int)uVar10 < (int)uVar16) && (puVar3[(int)uVar10] < uVar13)) {
          uVar14 = uVar14 + 2;
          iVar7 = 1;
          if ((int)uVar14 < (int)uVar16) {
            iVar7 = 1;
            do {
              uVar15 = (ulong)uVar14;
              uVar11 = puVar3[(int)uVar14];
              if (uVar13 <= uVar11) goto LAB_001043de;
              iVar4 = iVar7 * 2;
              uVar14 = uVar10 + iVar7 * 2;
              iVar7 = iVar4;
            } while ((int)uVar14 < (int)uVar16);
          }
          uVar11 = puVar3[(long)(int)uVar16 + -1];
          uVar15 = (long)(int)uVar16 - 1;
LAB_001043de:
          if (uVar11 != uVar13) {
            if (uVar11 < uVar13) {
              uVar15 = (ulong)uVar16;
            }
            else if ((iVar7 >> 1) + uVar10 + 1 != (int)uVar15) {
              uVar10 = (iVar7 >> 1) + uVar10;
              do {
                uVar16 = (int)(uVar10 + (int)uVar15) >> 1;
                if (puVar3[(int)uVar16] == uVar13) {
                  uVar15 = (ulong)uVar16;
                  break;
                }
                if (uVar13 <= puVar3[(int)uVar16]) {
                  uVar15 = (ulong)uVar16;
                  uVar16 = uVar10;
                }
                uVar10 = uVar16;
              } while (uVar10 + 1 != (int)uVar15);
            }
          }
        }
        else {
          uVar15 = (ulong)uVar10;
        }
      }
    } while (((int)uVar17 < (int)uVar1) && ((int)uVar15 < (int)local_3c));
  }
  return (roaring_bitmap_t *)local_38;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_and(const roaring_bitmap_t *x1,
                                     const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    uint32_t neededcap = length1 > length2 ? length2 : length1;
    roaring_bitmap_t *answer = roaring_bitmap_create_with_capacity(neededcap);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) || is_cow(x2));

    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 =
            ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
        const uint16_t s2 =
            ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            container_t *c = container_and(c1, type1, c2, type2, &result_type);

            if (container_nonzero_cardinality(c, result_type)) {
                ra_append(&answer->high_low_container, s1, c, result_type);
            } else {
                container_free(c, result_type);  // otherwise: memory leak!
            }
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            pos1 = ra_advance_until(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }
    return answer;
}